

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_precision.cpp
# Opt level: O0

void anon_unknown.dwarf_4ee43::find_lowerable_rvalues_visitor::stack_enter
               (ir_instruction *ir,void *data)

{
  undefined1 local_48 [8];
  stack_entry entry;
  find_lowerable_rvalues_visitor *state;
  void *data_local;
  ir_instruction *ir_local;
  
  entry.lowerable_children.super__Vector_base<ir_instruction_*,_std::allocator<ir_instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)data;
  stack_entry::stack_entry((stack_entry *)local_48);
  entry.instr._0_4_ =
       *(byte *)(entry.lowerable_children.
                 super__Vector_base<ir_instruction_*,_std::allocator<ir_instruction_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 6) & 1;
  local_48 = (undefined1  [8])ir;
  std::
  vector<(anonymous_namespace)::find_lowerable_rvalues_visitor::stack_entry,_std::allocator<(anonymous_namespace)::find_lowerable_rvalues_visitor::stack_entry>_>
  ::push_back((vector<(anonymous_namespace)::find_lowerable_rvalues_visitor::stack_entry,_std::allocator<(anonymous_namespace)::find_lowerable_rvalues_visitor::stack_entry>_>
               *)(entry.lowerable_children.
                  super__Vector_base<ir_instruction_*,_std::allocator<ir_instruction_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 7),(stack_entry *)local_48);
  stack_entry::~stack_entry((stack_entry *)local_48);
  return;
}

Assistant:

void
find_lowerable_rvalues_visitor::stack_enter(class ir_instruction *ir,
                                            void *data)
{
   find_lowerable_rvalues_visitor *state =
      (find_lowerable_rvalues_visitor *) data;

   /* Add a new stack entry for this instruction */
   stack_entry entry;

   entry.instr = ir;
   entry.state = state->in_assignee ? CANT_LOWER : UNKNOWN;

   state->stack.push_back(entry);
}